

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O0

void __thiscall MT32Emu::TVP::reset(TVP *this,Part *usePart,PartialParam *usePartialParam)

{
  Partial *partial;
  PartialParam *partialParam;
  uint key_00;
  uint velocity_00;
  Bit32u BVar1;
  Bit32s BVar2;
  PatchTemp *pPVar3;
  Poly *pPVar4;
  Synth *pSVar5;
  uint velocity;
  uint key;
  PartialParam *usePartialParam_local;
  Part *usePart_local;
  TVP *this_local;
  
  this->part = usePart;
  this->partialParam = usePartialParam;
  pPVar3 = Part::getPatchTemp(this->part);
  this->patchTemp = pPVar3;
  pPVar4 = Partial::getPoly(this->partial);
  key_00 = Poly::getKey(pPVar4);
  pPVar4 = Partial::getPoly(this->partial);
  velocity_00 = Poly::getVelocity(pPVar4);
  this->timeElapsed = 0;
  this->processTimerIncrement = 0;
  partial = this->partial;
  partialParam = this->partialParam;
  pPVar3 = this->patchTemp;
  pSVar5 = Partial::getSynth(this->partial);
  BVar1 = calcBasePitch(partial,partialParam,pPVar3,key_00,pSVar5->controlROMFeatures);
  this->basePitch = BVar1;
  BVar2 = calcTargetPitchOffsetWithoutLFO(this->partialParam,0,velocity_00);
  this->currentPitchOffset = BVar2;
  this->targetPitchOffsetWithoutLFO = this->currentPitchOffset;
  this->phase = 0;
  if ((this->partialParam->pitchEnv).timeKeyfollow == '\0') {
    this->timeKeyfollowSubtraction = '\0';
  }
  else {
    this->timeKeyfollowSubtraction =
         (Bit8s)((int)(key_00 - 0x3c) >> (5 - (this->partialParam->pitchEnv).timeKeyfollow & 0x1f));
  }
  this->lfoPitchOffset = 0;
  this->counter = 0;
  this->pitch = (Bit16u)this->basePitch;
  this->pitchOffsetChangePerBigTick = 0;
  this->targetPitchOffsetReachedBigTick = 0;
  this->shifts = 0;
  return;
}

Assistant:

void TVP::reset(const Part *usePart, const TimbreParam::PartialParam *usePartialParam) {
	part = usePart;
	partialParam = usePartialParam;
	patchTemp = part->getPatchTemp();

	unsigned int key = partial->getPoly()->getKey();
	unsigned int velocity = partial->getPoly()->getVelocity();

	// FIXME: We're using a per-TVP timer instead of a system-wide one for convenience.
	timeElapsed = 0;
	processTimerIncrement = 0;

	basePitch = calcBasePitch(partial, partialParam, patchTemp, key, partial->getSynth()->controlROMFeatures);
	currentPitchOffset = calcTargetPitchOffsetWithoutLFO(partialParam, 0, velocity);
	targetPitchOffsetWithoutLFO = currentPitchOffset;
	phase = 0;

	if (partialParam->pitchEnv.timeKeyfollow) {
		timeKeyfollowSubtraction = Bit32s(key - 60) >> (5 - partialParam->pitchEnv.timeKeyfollow); // PORTABILITY NOTE: Assumes arithmetic shift
	} else {
		timeKeyfollowSubtraction = 0;
	}
	lfoPitchOffset = 0;
	counter = 0;
	pitch = basePitch;

	// These don't really need to be initialised, but it aids debugging.
	pitchOffsetChangePerBigTick = 0;
	targetPitchOffsetReachedBigTick = 0;
	shifts = 0;
}